

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataflow.cpp
# Opt level: O0

BinaryOp * __thiscall nwcpp::Dataflow::CreateBinaryOp(Dataflow *this,char op,Node *lhs,Node *rhs)

{
  pointer pBVar1;
  unique_ptr<nwcpp::Node,_std::default_delete<nwcpp::Node>_> local_48;
  pointer local_40;
  pointer ptr;
  __single_object operation;
  Passkey passkey;
  Node *rhs_local;
  Node *lhs_local;
  Dataflow *pDStack_10;
  char op_local;
  Dataflow *this_local;
  
  rhs_local = lhs;
  lhs_local._7_1_ = op;
  pDStack_10 = this;
  Passkey::Passkey((Passkey *)&operation,this);
  std::make_unique<nwcpp::BinaryOp,nwcpp::Passkey&,char&,nwcpp::Node_const*&,nwcpp::Node_const*&>
            ((Passkey *)&ptr,(char *)&operation,(Node **)((long)&lhs_local + 7),&rhs_local);
  local_40 = std::unique_ptr<nwcpp::BinaryOp,_std::default_delete<nwcpp::BinaryOp>_>::get
                       ((unique_ptr<nwcpp::BinaryOp,_std::default_delete<nwcpp::BinaryOp>_> *)&ptr);
  std::unique_ptr<nwcpp::Node,std::default_delete<nwcpp::Node>>::
  unique_ptr<nwcpp::BinaryOp,std::default_delete<nwcpp::BinaryOp>,void>
            ((unique_ptr<nwcpp::Node,std::default_delete<nwcpp::Node>> *)&local_48,
             (unique_ptr<nwcpp::BinaryOp,_std::default_delete<nwcpp::BinaryOp>_> *)&ptr);
  std::
  vector<std::unique_ptr<nwcpp::Node,_std::default_delete<nwcpp::Node>_>,_std::allocator<std::unique_ptr<nwcpp::Node,_std::default_delete<nwcpp::Node>_>_>_>
  ::push_back(&this->nodes_,(value_type *)&local_48);
  std::unique_ptr<nwcpp::Node,_std::default_delete<nwcpp::Node>_>::~unique_ptr(&local_48);
  pBVar1 = local_40;
  std::unique_ptr<nwcpp::BinaryOp,_std::default_delete<nwcpp::BinaryOp>_>::~unique_ptr
            ((unique_ptr<nwcpp::BinaryOp,_std::default_delete<nwcpp::BinaryOp>_> *)&ptr);
  return pBVar1;
}

Assistant:

BinaryOp* Dataflow::CreateBinaryOp(char op, const Node* lhs, const Node* rhs) {
  Passkey passkey(this);
  auto operation = std::make_unique<BinaryOp>(passkey, op, lhs, rhs);
  const auto ptr = operation.get();
  nodes_.push_back(std::move(operation));
  return ptr;
}